

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O2

unique_ptr<enact::Expr,_std::default_delete<enact::Expr>_> __thiscall
enact::Parser::parseInterpolationExpr(Parser *this)

{
  bool bVar1;
  Parser *in_RSI;
  allocator<char> local_81;
  CompileContext *local_80;
  undefined1 local_78 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_68 [2];
  Token token;
  
  Token::Token(&token,&in_RSI->m_previous);
  std::make_unique<enact::StringExpr,std::__cxx11::string&>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_78 + 8));
  parseExpr((Parser *)local_78);
  bVar1 = consume(in_RSI,INTERPOLATION);
  if (bVar1) {
    parseInterpolationExpr((Parser *)(local_78 + 0x10));
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)(local_78 + 0x10),"Expected end of string interpolation",&local_81);
    expect(in_RSI,STRING,(string *)(local_78 + 0x10));
    std::__cxx11::string::~string((string *)(local_78 + 0x10));
    std::make_unique<enact::StringExpr,std::__cxx11::string&>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               (local_78 + 0x10));
  }
  local_80 = (CompileContext *)local_68[0]._0_8_;
  std::
  make_unique<enact::InterpolationExpr,std::unique_ptr<enact::StringExpr,std::default_delete<enact::StringExpr>>,std::unique_ptr<enact::Expr,std::default_delete<enact::Expr>>,std::unique_ptr<enact::Expr,std::default_delete<enact::Expr>>,enact::Token>
            ((unique_ptr<enact::StringExpr,_std::default_delete<enact::StringExpr>_> *)
             (local_78 + 0x10),
             (unique_ptr<enact::Expr,_std::default_delete<enact::Expr>_> *)(local_78 + 8),
             (unique_ptr<enact::Expr,_std::default_delete<enact::Expr>_> *)local_78,
             (Token *)&local_80);
  this->m_context = (CompileContext *)local_68[0]._0_8_;
  if (local_80 != (CompileContext *)0x0) {
    (**(code **)((local_80->m_source)._M_dataplus._M_p + 8))();
  }
  if ((CompileContext *)local_78._0_8_ != (CompileContext *)0x0) {
    (**(code **)((((string *)local_78._0_8_)->_M_dataplus)._M_p + 8))();
  }
  if ((long *)local_78._8_8_ != (long *)0x0) {
    (**(code **)(*(long *)local_78._8_8_ + 8))();
  }
  std::__cxx11::string::~string((string *)&token.lexeme);
  return (__uniq_ptr_data<enact::Expr,_std::default_delete<enact::Expr>,_true,_true>)
         (__uniq_ptr_data<enact::Expr,_std::default_delete<enact::Expr>,_true,_true>)this;
}

Assistant:

std::unique_ptr<Expr> Parser::parseInterpolationExpr() {
        Token token = m_previous;
        std::unique_ptr<StringExpr> start = std::make_unique<StringExpr>(m_previous.lexeme);
        std::unique_ptr<Expr> interpolated = parseExpr();
        std::unique_ptr<Expr> end;

        if (consume(TokenType::INTERPOLATION)) {
            end = parseInterpolationExpr();
        } else {
            expect(TokenType::STRING, "Expected end of string interpolation");
            end = std::make_unique<StringExpr>(m_previous.lexeme);
        }

        return std::make_unique<InterpolationExpr>(
                std::move(start),
                std::move(interpolated),
                std::move(end),
                std::move(token));
    }